

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void opj_tcd_makelayer_fixed(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_UINT32 final)

{
  opj_cp_t *poVar1;
  opj_tcd_tile_t *poVar2;
  opj_tcp_t *poVar3;
  opj_tcd_tilecomp_t *poVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_precinct_t *poVar6;
  OPJ_BOOL OVar7;
  int iVar8;
  opj_tcd_cblk_enc_t *poVar9;
  opj_tcd_layer_t *poVar10;
  OPJ_UINT32 local_544;
  OPJ_INT32 imsb;
  OPJ_UINT32 n;
  opj_tcd_layer_t *layer;
  opj_tcd_cblk_enc_t *cblk;
  opj_tcd_precinct_t *prc;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  opj_tcd_tilecomp_t *tilec;
  opj_tcp_t *tcd_tcp;
  opj_tcd_tile_t *tcd_tile;
  opj_cp_t *cp;
  uint local_4f0;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_INT32 matrice [10] [10] [3];
  int local_30;
  uint local_2c;
  OPJ_INT32 value;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 precno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  OPJ_UINT32 final_local;
  OPJ_UINT32 layno_local;
  opj_tcd_t *tcd_local;
  
  poVar1 = tcd->cp;
  poVar2 = tcd->tcd_image->tiles;
  poVar3 = tcd->tcp;
  for (bandno = 0; bandno < poVar2->numcomps; bandno = bandno + 1) {
    poVar4 = poVar2->comps;
    for (k = 0; k < poVar3->numlayers; k = k + 1) {
      for (local_4f0 = 0; local_4f0 < poVar4[bandno].numresolutions; local_4f0 = local_4f0 + 1) {
        for (cp._4_4_ = 0; cp._4_4_ < 3; cp._4_4_ = cp._4_4_ + 1) {
          (&j)[(ulong)k * 0x1e + (ulong)local_4f0 * 3 + (ulong)cp._4_4_] =
               (int)((float)(poVar1->m_specific_param).m_enc.m_matrice
                            [k * poVar4[bandno].numresolutions * 3 + local_4f0 * 3 + cp._4_4_] *
                    (float)((double)tcd->image->comps[bandno].prec / 16.0));
        }
      }
    }
    for (precno = 0; precno < poVar4[bandno].numresolutions; precno = precno + 1) {
      poVar5 = poVar4[bandno].resolutions;
      for (cblkno = 0; cblkno < poVar5[precno].numbands; cblkno = cblkno + 1) {
        OVar7 = opj_tcd_is_band_empty(poVar5[precno].bands + cblkno);
        if (OVar7 == 0) {
          for (value = 0; (uint)value < poVar5[precno].pw * poVar5[precno].ph; value = value + 1) {
            poVar6 = poVar5[precno].bands[cblkno].precincts;
            for (local_2c = 0; local_2c < poVar6[(uint)value].cw * poVar6[(uint)value].ch;
                local_2c = local_2c + 1) {
              poVar9 = poVar6[(uint)value].cblks.enc + local_2c;
              poVar10 = poVar9->layers + layno;
              iVar8 = tcd->image->comps[bandno].prec - poVar9->numbps;
              if (layno == 0) {
                if (iVar8 < (int)(&j)[(ulong)precno * 3 + (ulong)cblkno]) {
                  local_30 = (&j)[(ulong)precno * 3 + (ulong)cblkno] - iVar8;
                }
                else {
                  local_30 = 0;
                }
              }
              else {
                local_30 = (&j)[(ulong)layno * 0x1e + (ulong)precno * 3 + (ulong)cblkno] -
                           (&j)[(ulong)(layno - 1) * 0x1e + (ulong)precno * 3 + (ulong)cblkno];
                if (((int)(&j)[(ulong)(layno - 1) * 0x1e + (ulong)precno * 3 + (ulong)cblkno] <=
                     iVar8) &&
                   (local_30 = local_30 -
                               (iVar8 - (&j)[(ulong)(layno - 1) * 0x1e +
                                             (ulong)precno * 3 + (ulong)cblkno]), local_30 < 0)) {
                  local_30 = 0;
                }
              }
              if (layno == 0) {
                poVar9->numpassesinlayers = 0;
              }
              if (poVar9->numpassesinlayers == 0) {
                if (local_30 == 0) {
                  local_544 = poVar9->numpassesinlayers;
                }
                else {
                  local_544 = local_30 * 3 + -2 + poVar9->numpassesinlayers;
                }
              }
              else {
                local_544 = local_30 * 3 + poVar9->numpassesinlayers;
              }
              poVar10->numpasses = local_544 - poVar9->numpassesinlayers;
              if (poVar10->numpasses != 0) {
                if (poVar9->numpassesinlayers == 0) {
                  poVar10->len = poVar9->passes[local_544 - 1].rate;
                  poVar10->data = poVar9->data;
                }
                else {
                  poVar10->len = poVar9->passes[local_544 - 1].rate -
                                 poVar9->passes[poVar9->numpassesinlayers - 1].rate;
                  poVar10->data = poVar9->data + poVar9->passes[poVar9->numpassesinlayers - 1].rate;
                }
                if (final != 0) {
                  poVar9->numpassesinlayers = local_544;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void opj_tcd_makelayer_fixed(opj_tcd_t *tcd, OPJ_UINT32 layno,
                             OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_INT32 value;                        /*, matrice[tcd_tcp->numlayers][tcd_tile->comps[0].numresolutions][3]; */
    OPJ_INT32 matrice[10][10][3];
    OPJ_UINT32 i, j, k;

    opj_cp_t *cp = tcd->cp;
    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    opj_tcp_t *tcd_tcp = tcd->tcp;

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (i = 0; i < tcd_tcp->numlayers; i++) {
            for (j = 0; j < tilec->numresolutions; j++) {
                for (k = 0; k < 3; k++) {
                    matrice[i][j][k] =
                        (OPJ_INT32)((OPJ_FLOAT32)cp->m_specific_param.m_enc.m_matrice[i *
                                      tilec->numresolutions * 3 + j * 3 + k]
                                    * (OPJ_FLOAT32)(tcd->image->comps[compno].prec / 16.0));
                }
            }
        }

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;
                        OPJ_INT32 imsb = (OPJ_INT32)(tcd->image->comps[compno].prec -
                                                     cblk->numbps); /* number of bit-plan equal to zero */

                        /* Correction of the matrix of coefficient to include the IMSB information */
                        if (layno == 0) {
                            value = matrice[layno][resno][bandno];
                            if (imsb >= value) {
                                value = 0;
                            } else {
                                value -= imsb;
                            }
                        } else {
                            value = matrice[layno][resno][bandno] - matrice[layno - 1][resno][bandno];
                            if (imsb >= matrice[layno - 1][resno][bandno]) {
                                value -= (imsb - matrice[layno - 1][resno][bandno]);
                                if (value < 0) {
                                    value = 0;
                                }
                            }
                        }

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;
                        if (cblk->numpassesinlayers == 0) {
                            if (value != 0) {
                                n = 3 * (OPJ_UINT32)value - 2 + cblk->numpassesinlayers;
                            } else {
                                n = cblk->numpassesinlayers;
                            }
                        } else {
                            n = 3 * (OPJ_UINT32)value + cblk->numpassesinlayers;
                        }

                        layer->numpasses = n - cblk->numpassesinlayers;

                        if (!layer->numpasses) {
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                        }

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
}